

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

NULLCRef * NULLC::AutoArrayIndex(NULLCRef *__return_storage_ptr__,NULLCAutoArray *left,uint index)

{
  char *pcVar1;
  uint uVar2;
  uint index_local;
  NULLCAutoArray *left_local;
  
  memset(__return_storage_ptr__,0,0xc);
  if (left == (NULLCAutoArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else if (index < left->len) {
    __return_storage_ptr__->typeID = left->typeID;
    pcVar1 = left->ptr;
    uVar2 = nullcGetTypeSize(__return_storage_ptr__->typeID);
    __return_storage_ptr__->ptr = pcVar1 + index * uVar2;
  }
  else {
    nullcThrowError("ERROR: array index out of bounds");
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef NULLC::AutoArrayIndex(NULLCAutoArray* left, unsigned int index)
{
	NULLCRef ret = { 0, 0 };

	if(!left)
	{
		nullcThrowError("ERROR: null pointer access");
		return ret;
	}
	if(index >= left->len)
	{
		nullcThrowError("ERROR: array index out of bounds");
		return ret;
	}
	ret.typeID = left->typeID;
	ret.ptr = (char*)left->ptr + index * nullcGetTypeSize(ret.typeID);
	return ret;
}